

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

uint8_t * __thiscall
CoreML::Specification::CategoricalDistributionLayerParams::_InternalSerialize
          (CategoricalDistributionLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint8_t *puVar1;
  ulong uVar2;
  
  if (this->seed_ != 0) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteInt64ToArray(1,this->seed_,puVar1);
  }
  if (this->numsamples_ != 0) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteInt64ToArray
                       (2,this->numsamples_,puVar1);
  }
  if (this->islogits_ == true) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteBoolToArray(3,this->islogits_,puVar1);
  }
  if (this->eps_ != 0.0) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteFloatToArray(4,this->eps_,puVar1);
  }
  if (this->temperature_ != 0.0) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                       (5,this->temperature_,puVar1);
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return target;
  }
  uVar2 = uVar2 & 0xfffffffffffffffc;
  puVar1 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar2 + 8),*(int *)(uVar2 + 0x10),target);
  return puVar1;
}

Assistant:

uint8_t* CategoricalDistributionLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.CategoricalDistributionLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 seed = 1;
  if (this->_internal_seed() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(1, this->_internal_seed(), target);
  }

  // int64 numSamples = 2;
  if (this->_internal_numsamples() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(2, this->_internal_numsamples(), target);
  }

  // bool isLogits = 3;
  if (this->_internal_islogits() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(3, this->_internal_islogits(), target);
  }

  // float eps = 4;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_eps = this->_internal_eps();
  uint32_t raw_eps;
  memcpy(&raw_eps, &tmp_eps, sizeof(tmp_eps));
  if (raw_eps != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteFloatToArray(4, this->_internal_eps(), target);
  }

  // float temperature = 5;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_temperature = this->_internal_temperature();
  uint32_t raw_temperature;
  memcpy(&raw_temperature, &tmp_temperature, sizeof(tmp_temperature));
  if (raw_temperature != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteFloatToArray(5, this->_internal_temperature(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.CategoricalDistributionLayerParams)
  return target;
}